

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O3

_Bool al_is_compatible_bitmap(ALLEGRO_BITMAP *bitmap)

{
  _Bool _Var1;
  ALLEGRO_DISPLAY *pAVar2;
  
  pAVar2 = al_get_current_display();
  if (pAVar2 != (ALLEGRO_DISPLAY *)0x0) {
    _Var1 = (*pAVar2->vt->is_compatible_bitmap)(pAVar2,bitmap);
    return _Var1;
  }
  return false;
}

Assistant:

bool al_is_compatible_bitmap(ALLEGRO_BITMAP *bitmap)
{
   ALLEGRO_DISPLAY *display = al_get_current_display();
   ASSERT(bitmap);

   if (display) {
      ASSERT(display->vt);
      return display->vt->is_compatible_bitmap(display, bitmap);
   }

   return false;
}